

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall testing::internal::ExpectationBase::IsOverSaturated(ExpectationBase *this)

{
  bool bVar1;
  Cardinality *this_00;
  ExpectationBase *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  this_00 = cardinality(this);
  bVar1 = Cardinality::IsOverSaturatedByCallCount(this_00,this->call_count_);
  return bVar1;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return cardinality().IsOverSaturatedByCallCount(call_count_);
  }